

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall tinyusdz::Attribute::~Attribute(Attribute *this)

{
  vtable_type *pvVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  AttrMetas::~AttrMetas(&this->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_paths);
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)&(this->_var)._ts);
  pvVar1 = (this->_var)._value.v_.vtable;
  if (pvVar1 != (vtable_type *)0x0) {
    (*pvVar1->destroy)((storage_union *)&this->_var);
    (this->_var)._value.v_.vtable = (vtable_type *)0x0;
  }
  pcVar2 = (this->_type_name)._M_dataplus._M_p;
  paVar3 = &(this->_type_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->_name)._M_dataplus._M_p;
  paVar3 = &(this->_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Attribute() = default;